

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_restoreval(jit_State *J,GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref
                    ,TValue *o)

{
  uint rs_00;
  uint uVar1;
  double *pdVar2;
  SnapNo in_ECX;
  GCtrace *in_RDX;
  jit_State *in_RSI;
  ulong in_R8;
  uint in_R9D;
  TValue *unaff_retaddr;
  double *in_stack_00000008;
  Reg r;
  int32_t *sps;
  RegSP rs;
  IRType1 t;
  IRIns *ir;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TValue *in_stack_ffffffffffffff90;
  undefined3 in_stack_ffffffffffffff9c;
  undefined4 uVar3;
  byte bVar4;
  IRIns *pIVar5;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  
  pIVar5 = (in_RSI->cur).ir + in_R9D;
  uVar3 = CONCAT13((pIVar5->field_1).t.irt,in_stack_ffffffffffffff9c);
  rs_00 = (uint)(pIVar5->field_0).prev;
  if (in_R9D < 0x8000) {
    lj_ir_kvalue((lua_State *)CONCAT44(uVar3,rs_00),in_stack_ffffffffffffff90,
                 (IRIns *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    if ((in_R8 & 1L << ((byte)in_R9D & 0x3f)) != 0) {
      rs_00 = snap_renameref(&in_RSI->cur,in_ECX,in_R9D,rs_00);
    }
    bVar4 = (byte)((uint)uVar3 >> 0x18);
    if (rs_00 >> 8 == 0) {
      uVar1 = rs_00 & 0xff;
      if ((rs_00 & 0x80) == 0) {
        if ((bVar4 & 0x1f) - 0xf < 5) {
          *in_stack_00000008 = (double)(int)(&in_RDX[1].snap)[uVar1];
        }
        else if ((bVar4 & 0x1f) == 0xe) {
          *in_stack_00000008 = *(double *)(&in_RDX->nextgc + (ulong)(uVar1 - 0x10) * 2);
        }
        else if ((bVar4 & 0x1f) == 3) {
          *in_stack_00000008 = (double)(&in_RDX[1].snap)[uVar1];
        }
        else {
          if (2 < (bVar4 & 0x1f)) {
            *(int *)in_stack_00000008 = (int)(&in_RDX[1].snap)[uVar1];
          }
          *(uint *)((long)in_stack_00000008 + 4) = bVar4 & 0x1f ^ 0xffffffff;
        }
      }
      else {
        snap_restoreval(in_RSI,in_RDX,(ExitState *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),
                        (SnapNo)(in_R8 >> 0x20),CONCAT44(in_R9D,in_stack_ffffffffffffffa8),
                        (IRRef)((ulong)pIVar5 >> 0x20),unaff_retaddr);
      }
    }
    else {
      pdVar2 = (double *)((long)&in_RDX[2].mcode + (ulong)(rs_00 >> 8) * 4);
      if ((bVar4 & 0x1f) - 0xf < 5) {
        *in_stack_00000008 = (double)*(int *)pdVar2;
      }
      else if ((bVar4 & 0x1f) == 0xe) {
        *in_stack_00000008 = *pdVar2;
      }
      else if ((bVar4 & 0x1f) == 3) {
        *in_stack_00000008 = *pdVar2;
      }
      else {
        *(int *)in_stack_00000008 = *(int *)pdVar2;
        *(uint *)((long)in_stack_00000008 + 4) = bVar4 & 0x1f ^ 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

static void snap_restoreval(jit_State *J, GCtrace *T, ExitState *ex,
			    SnapNo snapno, BloomFilter rfilt,
			    IRRef ref, TValue *o)
{
  IRIns *ir = &T->ir[ref];
  IRType1 t = ir->t;
  RegSP rs = ir->prev;
  if (irref_isk(ref)) {  /* Restore constant slot. */
    lj_ir_kvalue(J->L, o, ir);
    return;
  }
  if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
    rs = snap_renameref(T, snapno, ref, rs);
  if (ra_hasspill(regsp_spill(rs))) {  /* Restore from spill slot. */
    int32_t *sps = &ex->spill[regsp_spill(rs)];
    if (irt_isinteger(t)) {
      setintV(o, *sps);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      o->u64 = *(uint64_t *)sps;
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = *(uint64_t *)sps;
    } else {
      lua_assert(!irt_ispri(t));  /* PRI refs never have a spill slot. */
      setgcrefi(o->gcr, *sps);
      setitype(o, irt_toitype(t));
    }
  } else {  /* Restore from register. */
    Reg r = regsp_reg(rs);
    if (ra_noreg(r)) {
      lua_assert(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
      snap_restoreval(J, T, ex, snapno, rfilt, ir->op1, o);
      if (LJ_DUALNUM) setnumV(o, (lua_Number)intV(o));
      return;
    } else if (irt_isinteger(t)) {
      setintV(o, (int32_t)ex->gpr[r-RID_MIN_GPR]);
#if !LJ_SOFTFP
    } else if (irt_isnum(t)) {
      setnumV(o, ex->fpr[r-RID_MIN_FPR]);
#endif
    } else if (LJ_64 && irt_islightud(t)) {
      /* 64 bit lightuserdata which may escape already has the tag bits. */
      o->u64 = ex->gpr[r-RID_MIN_GPR];
    } else {
      if (!irt_ispri(t))
	setgcrefi(o->gcr, ex->gpr[r-RID_MIN_GPR]);
      setitype(o, irt_toitype(t));
    }
  }
}